

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CManageClient.cpp
# Opt level: O0

bool __thiscall CManageClient::IsInWhiteList(CManageClient *this,in_addr_t ip)

{
  in_addr_t iVar1;
  bool bVar2;
  ArrayIndex AVar3;
  in_addr_t iVar4;
  Value *pVVar5;
  char *__cp;
  undefined1 local_80 [8];
  string balst_ip;
  uint local_4c;
  undefined1 local_48 [4];
  int i;
  Value allow_ip;
  in_addr_t ip_local;
  CManageClient *this_local;
  
  allow_ip.limit_._4_4_ = ip;
  bVar2 = Json::Value::empty(&this->m_Config);
  if (!bVar2) {
    pVVar5 = Json::Value::operator[](&this->m_Config,"white");
    Json::Value::Value((Value *)local_48,pVVar5);
    for (local_4c = 0; AVar3 = Json::Value::size((Value *)local_48), local_4c < AVar3;
        local_4c = local_4c + 1) {
      pVVar5 = Json::Value::operator[]((Value *)local_48,local_4c);
      Json::Value::asString_abi_cxx11_((string *)local_80,pVVar5);
      iVar1 = allow_ip.limit_._4_4_;
      __cp = (char *)std::__cxx11::string::c_str();
      iVar4 = inet_addr(__cp);
      bVar2 = iVar1 == iVar4;
      if (bVar2) {
        this_local._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_80);
      if (bVar2) goto LAB_0010f0f7;
    }
    bVar2 = false;
LAB_0010f0f7:
    Json::Value::~Value((Value *)local_48);
    if (bVar2) goto LAB_0010f111;
  }
  this_local._7_1_ = 0;
LAB_0010f111:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CManageClient::IsInWhiteList(in_addr_t ip) const {
    if(!m_Config.empty()){
        Json::Value allow_ip = m_Config["white"];
        for(int i = 0;i < allow_ip.size();i++){
            string balst_ip = allow_ip[i].asString();
            if(ip == inet_addr(balst_ip.c_str())){
                return true;
            }
        }
    }
    return false;
}